

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int source_set_dynamic_node_properties
              (SOURCE_HANDLE source,node_properties dynamic_node_properties_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE dynamic_node_properties_amqp_value;
  SOURCE_INSTANCE *source_instance;
  int result;
  node_properties dynamic_node_properties_value_local;
  SOURCE_HANDLE source_local;
  
  if (source == (SOURCE_HANDLE)0x0) {
    source_instance._4_4_ = 0x3253;
  }
  else {
    item_value = amqpvalue_create_node_properties(dynamic_node_properties_value);
    if (item_value == (AMQP_VALUE)0x0) {
      source_instance._4_4_ = 0x325b;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(source->composite_value,5,item_value);
      if (iVar1 == 0) {
        source_instance._4_4_ = 0;
      }
      else {
        source_instance._4_4_ = 0x3261;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return source_instance._4_4_;
}

Assistant:

int source_set_dynamic_node_properties(SOURCE_HANDLE source, node_properties dynamic_node_properties_value)
{
    int result;

    if (source == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOURCE_INSTANCE* source_instance = (SOURCE_INSTANCE*)source;
        AMQP_VALUE dynamic_node_properties_amqp_value = amqpvalue_create_node_properties(dynamic_node_properties_value);
        if (dynamic_node_properties_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(source_instance->composite_value, 5, dynamic_node_properties_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(dynamic_node_properties_amqp_value);
        }
    }

    return result;
}